

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O3

bov_order_t * bov_order_new(GLuint *elements,GLsizei n,GLenum usage)

{
  GLsizei GVar1;
  int iVar2;
  bov_order_t *pbVar3;
  int extraout_EDX;
  undefined4 in_register_00000034;
  void *pvVar4;
  bov_order_t *pbVar5;
  
  pvVar4 = (void *)CONCAT44(in_register_00000034,n);
  pbVar5 = (bov_order_t *)0xc;
  pbVar3 = (bov_order_t *)malloc(0xc);
  if (pbVar3 != (bov_order_t *)0x0) {
    GVar1 = 0;
    if (elements != (GLuint *)0x0) {
      GVar1 = n;
    }
    pbVar3->eboLen = GVar1;
    (*glad_glGenBuffers)(1,(GLuint *)pbVar3);
    (*glad_glBindBuffer)(0x8893,pbVar3->ebo);
    (*glad_glBufferData)(0x8893,(long)n * 4,elements,usage);
    pbVar3->eboCapacity = n;
    return pbVar3;
  }
  bov_order_new_cold_1();
  iVar2 = 0;
  if (pvVar4 != (void *)0x0) {
    iVar2 = extraout_EDX;
  }
  pbVar5->eboLen = iVar2;
  (*glad_glBindBuffer)(0x8893,pbVar5->ebo);
  if (pbVar5->eboCapacity < pbVar5->eboLen) {
    (*glad_glBufferData)(0x8893,(long)extraout_EDX << 2,pvVar4,0x88e8);
    pbVar5->eboCapacity = pbVar5->eboLen;
  }
  else if (pvVar4 != (void *)0x0) {
    (*glad_glBufferSubData)(0x8893,0,(long)extraout_EDX << 2,pvVar4);
  }
  return pbVar5;
}

Assistant:

bov_order_t* bov_order_new(const GLuint* elements, GLsizei n, GLenum usage)
{
	bov_order_t* order = malloc(sizeof(bov_order_t));
	CHECK_MALLOC(order);

	order->eboLen = elements==NULL ? 0 : n;

	glGenBuffers(1, &order->ebo);
	glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, order->ebo);
	glBufferData(GL_ELEMENT_ARRAY_BUFFER, n * sizeof(GLuint), elements, usage);
	order->eboCapacity = n;
	return order;
}